

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void __thiscall
embree::sse42::
BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
::occluded(BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
           *this,vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  OccludedFunc4 *pp_Var1;
  BVH *bvh;
  NodeRef root;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  CollideFunc p_Var11;
  char *pcVar12;
  IntersectFunc p_Var13;
  OccludedFunc p_Var14;
  PointQueryFunc p_Var15;
  char *pcVar16;
  char *pcVar17;
  IntersectFunc4 p_Var18;
  OccludedFunc4 p_Var19;
  char *pcVar20;
  IntersectFunc4 p_Var21;
  IntersectFunc8 p_Var22;
  undefined1 auVar23 [12];
  vfloat<4> vVar24;
  uint uVar25;
  ulong uVar26;
  int iVar27;
  undefined4 uVar28;
  RayK<4> *pRVar29;
  ulong uVar30;
  BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
  *pBVar31;
  BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
  *pBVar32;
  long lVar33;
  ulong uVar34;
  ulong uVar35;
  uint uVar36;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar37;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar38;
  NodeRef *pNVar39;
  bool bVar40;
  float fVar41;
  float fVar56;
  float fVar57;
  vint4 bi_1;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar58;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar59;
  float fVar65;
  float fVar68;
  vint4 bi;
  float fVar60;
  float fVar66;
  float fVar69;
  float fVar71;
  float fVar72;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  uint uVar67;
  uint uVar70;
  uint uVar73;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar64;
  float fVar74;
  float fVar75;
  float fVar76;
  vint4 ai;
  float fVar77;
  float fVar78;
  float fVar80;
  float fVar81;
  vint4 ai_1;
  float fVar82;
  undefined1 auVar79 [16];
  float fVar83;
  float fVar85;
  float fVar86;
  vint4 ai_3;
  undefined1 auVar84 [16];
  float fVar87;
  uint uVar90;
  uint uVar91;
  float fVar92;
  vint4 bi_2;
  undefined1 auVar88 [16];
  uint uVar93;
  undefined1 auVar89 [16];
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar100;
  float fVar101;
  vint4 bi_3;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar102;
  uint uVar103;
  uint uVar104;
  uint uVar105;
  vint4 ai_2;
  uint uVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar113;
  float fVar114;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar115;
  undefined1 auVar112 [16];
  float fVar116;
  float fVar117;
  float fVar118;
  uint uVar119;
  uint uVar120;
  uint uVar121;
  uint uVar122;
  uint uVar123;
  float fVar124;
  uint uVar125;
  float fVar126;
  uint uVar127;
  float fVar128;
  uint uVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  uint uVar141;
  uint uVar142;
  uint uVar143;
  uint uVar144;
  uint uVar145;
  TravRayK<4,_false> *tray_00;
  size_t sVar146;
  Precalculations pre;
  float local_1968;
  float fStack_1964;
  float fStack_1960;
  float fStack_195c;
  vbool<4> terminated;
  float local_18a8;
  float fStack_18a4;
  float fStack_18a0;
  float fStack_189c;
  float local_1898;
  float fStack_1894;
  float fStack_1890;
  float fStack_188c;
  float local_1888;
  float fStack_1884;
  float fStack_1880;
  float fStack_187c;
  float local_1878;
  float fStack_1874;
  float fStack_1870;
  float fStack_186c;
  float local_1868;
  float fStack_1864;
  float fStack_1860;
  float fStack_185c;
  float local_1858;
  float fStack_1854;
  float fStack_1850;
  float fStack_184c;
  float local_1848;
  float fStack_1844;
  float fStack_1840;
  float fStack_183c;
  float local_1838;
  float fStack_1834;
  float fStack_1830;
  float fStack_182c;
  TravRayK<4,_false> tray;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  bvh = (BVH *)(valid_i->field_0).v[0];
  if ((bvh->root).ptr != 8) {
    pRVar29 = ray;
    if ((*(long *)(ray + 8) != 0) &&
       (pRVar29 = *(RayK<4> **)(ray + 0x10), ((byte)pRVar29[2] & 1) != 0)) {
      occludedCoherent(this,valid_i,This,ray,context);
      return;
    }
    auVar62 = *(undefined1 (*) [16])&(This->intersector4_nofilter).name;
    auVar84._0_12_ = ZEXT812(0);
    auVar84._12_4_ = 0;
    uVar123 = -(uint)(0.0 <= auVar62._0_4_ && *(int *)this == -1);
    uVar125 = -(uint)(0.0 <= auVar62._4_4_ && *(int *)(this + 4) == -1);
    uVar127 = -(uint)(0.0 <= auVar62._8_4_ && *(int *)(this + 8) == -1);
    uVar129 = -(uint)(0.0 <= auVar62._12_4_ && *(int *)(this + 0xc) == -1);
    auVar44._4_4_ = uVar125;
    auVar44._0_4_ = uVar123;
    auVar44._8_4_ = uVar127;
    auVar44._12_4_ = uVar129;
    iVar27 = movmskps((int)pRVar29,auVar44);
    if (iVar27 != 0) {
      tray.org.field_0._0_8_ = This->ptr;
      tray.org.field_0._8_8_ = This->leafIntersector;
      tray.org.field_0._16_8_ = (This->collider).collide;
      tray.org.field_0._24_8_ = (This->collider).name;
      tray.org.field_0._32_8_ = (This->intersector1).intersect;
      tray.org.field_0._40_8_ = (This->intersector1).occluded;
      tray.dir.field_0._0_8_ = (This->intersector4).intersect;
      tray.dir.field_0._8_8_ = (This->intersector4).occluded;
      tray.dir.field_0.field_0.y.field_0 =
           (vfloat_impl<4>)*(undefined1 (*) [16])&(This->intersector4).name;
      tray.dir.field_0._32_8_ = (This->intersector4_filter).occluded;
      tray.dir.field_0._40_8_ = (This->intersector4_filter).name;
      fVar59 = (float)DAT_01ff1d40;
      fVar65 = DAT_01ff1d40._4_4_;
      fVar68 = DAT_01ff1d40._8_4_;
      fVar71 = DAT_01ff1d40._12_4_;
      auVar98._4_4_ = -(uint)(ABS((float)((ulong)tray.dir.field_0._0_8_ >> 0x20)) < fVar65);
      auVar98._0_4_ = -(uint)(ABS((float)tray.dir.field_0._0_8_) < fVar59);
      auVar98._8_4_ = -(uint)(ABS((float)tray.dir.field_0._8_8_) < fVar68);
      auVar98._12_4_ = -(uint)(ABS((float)((ulong)tray.dir.field_0._8_8_ >> 0x20)) < fVar71);
      auVar110 = blendvps((undefined1  [16])tray.dir.field_0.field_0.x.field_0,_DAT_01ff1d40,auVar98
                         );
      auVar42._4_4_ = -(uint)(ABS(tray.dir.field_0._20_4_) < fVar65);
      auVar42._0_4_ = -(uint)(ABS(tray.dir.field_0._16_4_) < fVar59);
      auVar42._8_4_ = -(uint)(ABS(tray.dir.field_0._24_4_) < fVar68);
      auVar42._12_4_ = -(uint)(ABS(tray.dir.field_0._28_4_) < fVar71);
      auVar98 = blendvps((undefined1  [16])tray.dir.field_0.field_0.y.field_0,_DAT_01ff1d40,auVar42)
      ;
      auVar43._4_4_ = -(uint)(ABS((float)((ulong)tray.dir.field_0._32_8_ >> 0x20)) < fVar65);
      auVar43._0_4_ = -(uint)(ABS((float)tray.dir.field_0._32_8_) < fVar59);
      auVar43._8_4_ = -(uint)(ABS((float)tray.dir.field_0._40_8_) < fVar68);
      auVar43._12_4_ = -(uint)(ABS((float)((ulong)tray.dir.field_0._40_8_ >> 0x20)) < fVar71);
      auVar88 = blendvps((undefined1  [16])tray.dir.field_0.field_0.z.field_0,_DAT_01ff1d40,auVar43)
      ;
      auVar44 = rcpps(auVar43,auVar110);
      fVar59 = auVar44._0_4_;
      auVar111._0_4_ = auVar110._0_4_ * fVar59;
      fVar65 = auVar44._4_4_;
      auVar111._4_4_ = auVar110._4_4_ * fVar65;
      fVar68 = auVar44._8_4_;
      auVar111._8_4_ = auVar110._8_4_ * fVar68;
      fVar71 = auVar44._12_4_;
      auVar111._12_4_ = auVar110._12_4_ * fVar71;
      tray.rdir.field_0._0_4_ = (1.0 - auVar111._0_4_) * fVar59 + fVar59;
      tray.rdir.field_0._4_4_ = (1.0 - auVar111._4_4_) * fVar65 + fVar65;
      tray.rdir.field_0._8_4_ = (1.0 - auVar111._8_4_) * fVar68 + fVar68;
      tray.rdir.field_0._12_4_ = (1.0 - auVar111._12_4_) * fVar71 + fVar71;
      auVar44 = rcpps(auVar111,auVar98);
      fVar59 = auVar44._0_4_;
      auVar99._0_4_ = auVar98._0_4_ * fVar59;
      fVar65 = auVar44._4_4_;
      auVar99._4_4_ = auVar98._4_4_ * fVar65;
      fVar68 = auVar44._8_4_;
      auVar99._8_4_ = auVar98._8_4_ * fVar68;
      fVar71 = auVar44._12_4_;
      auVar99._12_4_ = auVar98._12_4_ * fVar71;
      tray.rdir.field_0._16_4_ = (1.0 - auVar99._0_4_) * fVar59 + fVar59;
      tray.rdir.field_0._20_4_ = (1.0 - auVar99._4_4_) * fVar65 + fVar65;
      tray.rdir.field_0._24_4_ = (1.0 - auVar99._8_4_) * fVar68 + fVar68;
      tray.rdir.field_0._28_4_ = (1.0 - auVar99._12_4_) * fVar71 + fVar71;
      auVar44 = rcpps(auVar99,auVar88);
      fVar59 = auVar44._0_4_;
      fVar65 = auVar44._4_4_;
      fVar68 = auVar44._8_4_;
      fVar71 = auVar44._12_4_;
      tray.rdir.field_0._32_4_ = (1.0 - auVar88._0_4_ * fVar59) * fVar59 + fVar59;
      tray.rdir.field_0._36_4_ = (1.0 - auVar88._4_4_ * fVar65) * fVar65 + fVar65;
      tray.rdir.field_0._40_4_ = (1.0 - auVar88._8_4_ * fVar68) * fVar68 + fVar68;
      tray.rdir.field_0._44_4_ = (1.0 - auVar88._12_4_ * fVar71) * fVar71 + fVar71;
      tray.nearXYZ.field_0._0_4_ = -(uint)((float)tray.rdir.field_0._0_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._4_4_ = -(uint)((float)tray.rdir.field_0._4_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._8_4_ = -(uint)((float)tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)((float)tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar110._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._20_4_);
      auVar110._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._16_4_);
      auVar110._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._24_4_);
      auVar110._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_0201fed0,_DAT_01ffd210,auVar110);
      auVar45._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._36_4_);
      auVar45._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._32_4_);
      auVar45._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._40_4_);
      auVar45._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_0201fef0,_DAT_0201fee0,auVar45);
      auVar88._0_8_ = (This->intersector1).pointQuery;
      auVar88._8_8_ = (This->intersector1).name;
      auVar88 = maxps(auVar88,auVar84);
      auVar44 = maxps(auVar62,auVar84);
      fVar59 = (float)DAT_01feb9f0;
      fVar65 = DAT_01feb9f0._4_4_;
      fVar68 = DAT_01feb9f0._8_4_;
      fVar71 = DAT_01feb9f0._12_4_;
      auVar62._4_4_ = uVar125;
      auVar62._0_4_ = uVar123;
      auVar62._8_4_ = uVar127;
      auVar62._12_4_ = uVar129;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01feb9f0,auVar88,auVar62);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01feba00,auVar44,auVar62);
      terminated.field_0._0_8_ = CONCAT44(uVar125,uVar123) ^ 0xffffffffffffffff;
      terminated.field_0.i[2] = uVar127 ^ 0xffffffff;
      terminated.field_0.i[3] = uVar129 ^ 0xffffffff;
      if (*(long *)(ray + 8) == 0) {
        uVar36 = 3;
      }
      else {
        uVar36 = ((*(byte *)(*(long *)(ray + 0x10) + 2) & 1) == 0) + 2;
      }
      pNVar39 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[0].field_0 = _DAT_01feb9f0;
      sVar146 = (bvh->root).ptr;
      stack_node[1].ptr = sVar146;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      paVar37 = &stack_near[2].field_0;
LAB_00246222:
      paVar38 = paVar37 + -1;
      root.ptr = pNVar39[-1].ptr;
      pNVar39 = pNVar39 + -1;
      if (root.ptr == 0xfffffffffffffff8) goto LAB_00246c11;
      local_1968 = paVar38->v[0];
      fStack_1964 = *(float *)((long)paVar37 + -0xc);
      fStack_1960 = *(float *)((long)paVar37 + -8);
      fStack_195c = *(float *)((long)paVar37 + -4);
      vVar24.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar38->v;
      auVar46._4_4_ = -(uint)(fStack_1964 < tray.tfar.field_0.v[1]);
      auVar46._0_4_ = -(uint)(local_1968 < tray.tfar.field_0.v[0]);
      auVar46._8_4_ = -(uint)(fStack_1960 < tray.tfar.field_0.v[2]);
      auVar46._12_4_ = -(uint)(fStack_195c < tray.tfar.field_0.v[3]);
      uVar25 = movmskps((int)sVar146,auVar46);
      if (uVar25 == 0) {
LAB_00246c22:
        sVar146 = 2;
      }
      else {
        uVar26 = (ulong)(uVar25 & 0xff);
        uVar25 = POPCOUNT(uVar25 & 0xff);
        sVar146 = 0;
        if (uVar25 <= uVar36) {
          do {
            sVar146 = 0;
            if (uVar26 != 0) {
              for (; (uVar26 >> sVar146 & 1) == 0; sVar146 = sVar146 + 1) {
              }
            }
            tray_00 = &tray;
            this = (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
                    *)valid_i;
            bVar40 = occluded1((Intersectors *)valid_i,bvh,root,sVar146,&pre,(RayK<4> *)This,tray_00
                               ,(RayQueryContext *)ray);
            if (bVar40) {
              terminated.field_0.i[sVar146] = -1;
            }
            uVar26 = uVar26 & uVar26 - 1;
          } while (uVar26 != 0);
          iVar27 = movmskps((int)tray_00,(undefined1  [16])terminated.field_0);
          sVar146 = 3;
          fVar59 = INFINITY;
          fVar65 = INFINITY;
          fVar68 = INFINITY;
          fVar71 = INFINITY;
          local_1968 = vVar24.field_0._0_4_;
          fStack_1964 = vVar24.field_0._4_4_;
          fStack_1960 = vVar24.field_0._8_4_;
          fStack_195c = vVar24.field_0._12_4_;
          if (iVar27 != 0xf) {
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01feba00,
                          (undefined1  [16])terminated.field_0);
            sVar146 = 2;
          }
        }
        uVar28 = (undefined4)sVar146;
        if (uVar36 < uVar25) {
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00246c11;
              auVar49._4_4_ = -(uint)(fStack_1964 < tray.tfar.field_0.v[1]);
              auVar49._0_4_ = -(uint)(local_1968 < tray.tfar.field_0.v[0]);
              auVar49._8_4_ = -(uint)(fStack_1960 < tray.tfar.field_0.v[2]);
              auVar49._12_4_ = -(uint)(fStack_195c < tray.tfar.field_0.v[3]);
              iVar27 = movmskps(uVar28,auVar49);
              if (iVar27 == 0) goto LAB_00246c22;
              uVar26 = (ulong)((uint)root.ptr & 0xf) - 8;
              aVar64 = terminated.field_0;
              if (uVar26 == 0) goto LAB_00246be4;
              auVar63._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
              auVar63._8_4_ = terminated.field_0._8_4_ ^ 0xffffffff;
              auVar63._12_4_ = terminated.field_0._12_4_ ^ 0xffffffff;
              p_Var11 = (This->collider).collide;
              pcVar12 = (This->collider).name;
              p_Var13 = (This->intersector1).intersect;
              p_Var14 = (This->intersector1).occluded;
              p_Var15 = (This->intersector1).pointQuery;
              pcVar16 = (This->intersector1).name;
              pcVar17 = (This->intersector4).name;
              p_Var18 = (This->intersector4_filter).intersect;
              pp_Var1 = &(This->intersector4_filter).occluded;
              p_Var19 = *pp_Var1;
              pcVar20 = (This->intersector4_filter).name;
              auVar23 = *(undefined1 (*) [12])pp_Var1;
              local_1878 = SUB84(p_Var19,0);
              fStack_1874 = (float)((ulong)p_Var19 >> 0x20);
              fStack_1870 = SUB84(pcVar20,0);
              fStack_186c = (float)((ulong)pcVar20 >> 0x20);
              p_Var21 = (This->intersector4).intersect;
              p_Var19 = (This->intersector4).occluded;
              pcVar20 = (This->intersector4_nofilter).name;
              p_Var22 = (This->intersector8).intersect;
              uVar25 = *(uint *)&(This->intersector8).occluded;
              uVar90 = *(uint *)((long)&(This->intersector8).occluded + 4);
              uVar91 = *(uint *)&(This->intersector8).name;
              uVar93 = *(uint *)((long)&(This->intersector8).name + 4);
              lVar33 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
              uVar30 = 0;
              goto LAB_002464fb;
            }
            pBVar31 = (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
                       *)0x0;
            uVar26 = 8;
            local_1968 = fVar59;
            fStack_1964 = fVar65;
            fStack_1960 = fVar68;
            fStack_195c = fVar71;
            do {
              uVar30 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + (long)pBVar31 * 8);
              if (uVar30 != 8) {
                fVar102 = *(float *)(root.ptr + 0x20 + (long)pBVar31 * 4);
                fVar41 = *(float *)(root.ptr + 0x30 + (long)pBVar31 * 4);
                fVar56 = *(float *)(root.ptr + 0x40 + (long)pBVar31 * 4);
                fVar58 = *(float *)(root.ptr + 0x50 + (long)pBVar31 * 4);
                fVar74 = (fVar102 - (float)tray.org.field_0._0_4_) * (float)tray.rdir.field_0._0_4_;
                fVar75 = (fVar102 - (float)tray.org.field_0._4_4_) * (float)tray.rdir.field_0._4_4_;
                fVar76 = (fVar102 - (float)tray.org.field_0._8_4_) * (float)tray.rdir.field_0._8_4_;
                fVar77 = (fVar102 - (float)tray.org.field_0._12_4_) *
                         (float)tray.rdir.field_0._12_4_;
                fVar78 = (fVar56 - (float)tray.org.field_0._16_4_) * (float)tray.rdir.field_0._16_4_
                ;
                fVar80 = (fVar56 - (float)tray.org.field_0._20_4_) * (float)tray.rdir.field_0._20_4_
                ;
                fVar81 = (fVar56 - (float)tray.org.field_0._24_4_) * (float)tray.rdir.field_0._24_4_
                ;
                fVar82 = (fVar56 - (float)tray.org.field_0._28_4_) * (float)tray.rdir.field_0._28_4_
                ;
                fVar102 = *(float *)(root.ptr + 0x60 + (long)pBVar31 * 4);
                fVar83 = (fVar102 - (float)tray.org.field_0._32_4_) *
                         (float)tray.rdir.field_0._32_4_;
                fVar85 = (fVar102 - (float)tray.org.field_0._36_4_) *
                         (float)tray.rdir.field_0._36_4_;
                fVar86 = (fVar102 - (float)tray.org.field_0._40_4_) *
                         (float)tray.rdir.field_0._40_4_;
                fVar87 = (fVar102 - (float)tray.org.field_0._44_4_) *
                         (float)tray.rdir.field_0._44_4_;
                fVar60 = (fVar41 - (float)tray.org.field_0._0_4_) * (float)tray.rdir.field_0._0_4_;
                fVar66 = (fVar41 - (float)tray.org.field_0._4_4_) * (float)tray.rdir.field_0._4_4_;
                fVar69 = (fVar41 - (float)tray.org.field_0._8_4_) * (float)tray.rdir.field_0._8_4_;
                fVar72 = (fVar41 - (float)tray.org.field_0._12_4_) * (float)tray.rdir.field_0._12_4_
                ;
                fVar41 = (fVar58 - (float)tray.org.field_0._16_4_) * (float)tray.rdir.field_0._16_4_
                ;
                fVar56 = (fVar58 - (float)tray.org.field_0._20_4_) * (float)tray.rdir.field_0._20_4_
                ;
                fVar57 = (fVar58 - (float)tray.org.field_0._24_4_) * (float)tray.rdir.field_0._24_4_
                ;
                fVar58 = (fVar58 - (float)tray.org.field_0._28_4_) * (float)tray.rdir.field_0._28_4_
                ;
                fVar102 = *(float *)(root.ptr + 0x70 + (long)pBVar31 * 4);
                fVar95 = (fVar102 - (float)tray.org.field_0._32_4_) *
                         (float)tray.rdir.field_0._32_4_;
                fVar100 = (fVar102 - (float)tray.org.field_0._36_4_) *
                          (float)tray.rdir.field_0._36_4_;
                fVar101 = (fVar102 - (float)tray.org.field_0._40_4_) *
                          (float)tray.rdir.field_0._40_4_;
                fVar102 = (fVar102 - (float)tray.org.field_0._44_4_) *
                          (float)tray.rdir.field_0._44_4_;
                uVar25 = (uint)((int)fVar60 < (int)fVar74) * (int)fVar60 |
                         (uint)((int)fVar60 >= (int)fVar74) * (int)fVar74;
                uVar90 = (uint)((int)fVar66 < (int)fVar75) * (int)fVar66 |
                         (uint)((int)fVar66 >= (int)fVar75) * (int)fVar75;
                uVar91 = (uint)((int)fVar69 < (int)fVar76) * (int)fVar69 |
                         (uint)((int)fVar69 >= (int)fVar76) * (int)fVar76;
                uVar93 = (uint)((int)fVar72 < (int)fVar77) * (int)fVar72 |
                         (uint)((int)fVar72 >= (int)fVar77) * (int)fVar77;
                uVar103 = (uint)((int)fVar41 < (int)fVar78) * (int)fVar41 |
                          (uint)((int)fVar41 >= (int)fVar78) * (int)fVar78;
                uVar104 = (uint)((int)fVar56 < (int)fVar80) * (int)fVar56 |
                          (uint)((int)fVar56 >= (int)fVar80) * (int)fVar80;
                uVar105 = (uint)((int)fVar57 < (int)fVar81) * (int)fVar57 |
                          (uint)((int)fVar57 >= (int)fVar81) * (int)fVar81;
                uVar106 = (uint)((int)fVar58 < (int)fVar82) * (int)fVar58 |
                          (uint)((int)fVar58 >= (int)fVar82) * (int)fVar82;
                uVar103 = ((int)uVar103 < (int)uVar25) * uVar25 |
                          ((int)uVar103 >= (int)uVar25) * uVar103;
                uVar104 = ((int)uVar104 < (int)uVar90) * uVar90 |
                          ((int)uVar104 >= (int)uVar90) * uVar104;
                uVar105 = ((int)uVar105 < (int)uVar91) * uVar91 |
                          ((int)uVar105 >= (int)uVar91) * uVar105;
                uVar106 = ((int)uVar106 < (int)uVar93) * uVar93 |
                          ((int)uVar106 >= (int)uVar93) * uVar106;
                uVar25 = (uint)((int)fVar95 < (int)fVar83) * (int)fVar95 |
                         (uint)((int)fVar95 >= (int)fVar83) * (int)fVar83;
                uVar90 = (uint)((int)fVar100 < (int)fVar85) * (int)fVar100 |
                         (uint)((int)fVar100 >= (int)fVar85) * (int)fVar85;
                uVar91 = (uint)((int)fVar101 < (int)fVar86) * (int)fVar101 |
                         (uint)((int)fVar101 >= (int)fVar86) * (int)fVar86;
                uVar93 = (uint)((int)fVar102 < (int)fVar87) * (int)fVar102 |
                         (uint)((int)fVar102 >= (int)fVar87) * (int)fVar87;
                auVar89._0_4_ =
                     ((int)uVar25 < (int)uVar103) * uVar103 | ((int)uVar25 >= (int)uVar103) * uVar25
                ;
                auVar89._4_4_ =
                     ((int)uVar90 < (int)uVar104) * uVar104 | ((int)uVar90 >= (int)uVar104) * uVar90
                ;
                auVar89._8_4_ =
                     ((int)uVar91 < (int)uVar105) * uVar105 | ((int)uVar91 >= (int)uVar105) * uVar91
                ;
                auVar89._12_4_ =
                     ((int)uVar93 < (int)uVar106) * uVar106 | ((int)uVar93 >= (int)uVar106) * uVar93
                ;
                uVar103 = (uint)((int)fVar60 < (int)fVar74) * (int)fVar74 |
                          (uint)((int)fVar60 >= (int)fVar74) * (int)fVar60;
                uVar104 = (uint)((int)fVar66 < (int)fVar75) * (int)fVar75 |
                          (uint)((int)fVar66 >= (int)fVar75) * (int)fVar66;
                uVar105 = (uint)((int)fVar69 < (int)fVar76) * (int)fVar76 |
                          (uint)((int)fVar69 >= (int)fVar76) * (int)fVar69;
                uVar106 = (uint)((int)fVar72 < (int)fVar77) * (int)fVar77 |
                          (uint)((int)fVar72 >= (int)fVar77) * (int)fVar72;
                uVar25 = (uint)((int)fVar41 < (int)fVar78) * (int)fVar78 |
                         (uint)((int)fVar41 >= (int)fVar78) * (int)fVar41;
                uVar90 = (uint)((int)fVar56 < (int)fVar80) * (int)fVar80 |
                         (uint)((int)fVar56 >= (int)fVar80) * (int)fVar56;
                uVar91 = (uint)((int)fVar57 < (int)fVar81) * (int)fVar81 |
                         (uint)((int)fVar57 >= (int)fVar81) * (int)fVar57;
                uVar93 = (uint)((int)fVar58 < (int)fVar82) * (int)fVar82 |
                         (uint)((int)fVar58 >= (int)fVar82) * (int)fVar58;
                uVar25 = ((int)uVar103 < (int)uVar25) * uVar103 |
                         ((int)uVar103 >= (int)uVar25) * uVar25;
                uVar90 = ((int)uVar104 < (int)uVar90) * uVar104 |
                         ((int)uVar104 >= (int)uVar90) * uVar90;
                uVar91 = ((int)uVar105 < (int)uVar91) * uVar105 |
                         ((int)uVar105 >= (int)uVar91) * uVar91;
                uVar93 = ((int)uVar106 < (int)uVar93) * uVar106 |
                         ((int)uVar106 >= (int)uVar93) * uVar93;
                uVar103 = (uint)((int)fVar95 < (int)fVar83) * (int)fVar83 |
                          (uint)((int)fVar95 >= (int)fVar83) * (int)fVar95;
                uVar104 = (uint)((int)fVar100 < (int)fVar85) * (int)fVar85 |
                          (uint)((int)fVar100 >= (int)fVar85) * (int)fVar100;
                uVar105 = (uint)((int)fVar101 < (int)fVar86) * (int)fVar86 |
                          (uint)((int)fVar101 >= (int)fVar86) * (int)fVar101;
                uVar106 = (uint)((int)fVar102 < (int)fVar87) * (int)fVar87 |
                          (uint)((int)fVar102 >= (int)fVar87) * (int)fVar102;
                uVar25 = ((int)uVar25 < (int)uVar103) * uVar25 |
                         ((int)uVar25 >= (int)uVar103) * uVar103;
                uVar90 = ((int)uVar90 < (int)uVar104) * uVar90 |
                         ((int)uVar90 >= (int)uVar104) * uVar104;
                uVar91 = ((int)uVar91 < (int)uVar105) * uVar91 |
                         ((int)uVar91 >= (int)uVar105) * uVar105;
                uVar93 = ((int)uVar93 < (int)uVar106) * uVar93 |
                         ((int)uVar93 >= (int)uVar106) * uVar106;
                auVar47._4_4_ =
                     -(uint)((float)((tray.tnear.field_0.i[1] < (int)auVar89._4_4_) * auVar89._4_4_
                                    | (uint)(tray.tnear.field_0.i[1] >= (int)auVar89._4_4_) *
                                      tray.tnear.field_0.i[1]) <=
                            (float)((uint)(tray.tfar.field_0.i[1] < (int)uVar90) *
                                    tray.tfar.field_0.i[1] |
                                   (tray.tfar.field_0.i[1] >= (int)uVar90) * uVar90));
                auVar47._0_4_ =
                     -(uint)((float)((tray.tnear.field_0.i[0] < (int)auVar89._0_4_) * auVar89._0_4_
                                    | (uint)(tray.tnear.field_0.i[0] >= (int)auVar89._0_4_) *
                                      tray.tnear.field_0.i[0]) <=
                            (float)((uint)(tray.tfar.field_0.i[0] < (int)uVar25) *
                                    tray.tfar.field_0.i[0] |
                                   (tray.tfar.field_0.i[0] >= (int)uVar25) * uVar25));
                auVar47._8_4_ =
                     -(uint)((float)((tray.tnear.field_0.i[2] < (int)auVar89._8_4_) * auVar89._8_4_
                                    | (uint)(tray.tnear.field_0.i[2] >= (int)auVar89._8_4_) *
                                      tray.tnear.field_0.i[2]) <=
                            (float)((uint)(tray.tfar.field_0.i[2] < (int)uVar91) *
                                    tray.tfar.field_0.i[2] |
                                   (tray.tfar.field_0.i[2] >= (int)uVar91) * uVar91));
                auVar47._12_4_ =
                     -(uint)((float)((tray.tnear.field_0.i[3] < (int)auVar89._12_4_) *
                                     auVar89._12_4_ |
                                    (uint)(tray.tnear.field_0.i[3] >= (int)auVar89._12_4_) *
                                    tray.tnear.field_0.i[3]) <=
                            (float)((uint)(tray.tfar.field_0.i[3] < (int)uVar93) *
                                    tray.tfar.field_0.i[3] |
                                   (tray.tfar.field_0.i[3] >= (int)uVar93) * uVar93));
                uVar25 = movmskps((int)this,auVar47);
                this = (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
                        *)(ulong)uVar25;
                if (uVar25 != 0) {
                  auVar61._4_4_ = fVar65;
                  auVar61._0_4_ = fVar59;
                  auVar61._8_4_ = fVar68;
                  auVar61._12_4_ = fVar71;
                  auVar62 = blendvps(auVar61,auVar89,auVar47);
                  if (uVar26 != 8) {
                    pNVar39->ptr = uVar26;
                    pNVar39 = pNVar39 + 1;
                    paVar38->v[0] = local_1968;
                    paVar38->v[1] = fStack_1964;
                    paVar38->v[2] = fStack_1960;
                    paVar38->v[3] = fStack_195c;
                    paVar38 = paVar38 + 1;
                  }
                  local_1968 = auVar62._0_4_;
                  fStack_1964 = auVar62._4_4_;
                  fStack_1960 = auVar62._8_4_;
                  fStack_195c = auVar62._12_4_;
                  uVar26 = uVar30;
                }
              }
            } while ((uVar30 != 8) &&
                    (this = pBVar31 + 1,
                    bVar40 = pBVar31 < (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
                                        *)0x3, pBVar31 = this, bVar40));
            sVar146 = 0;
            if (uVar26 == 8) {
LAB_00246418:
              bVar40 = false;
              sVar146 = 4;
            }
            else {
              auVar48._4_4_ = -(uint)(fStack_1964 < tray.tfar.field_0.v[1]);
              auVar48._0_4_ = -(uint)(local_1968 < tray.tfar.field_0.v[0]);
              auVar48._8_4_ = -(uint)(fStack_1960 < tray.tfar.field_0.v[2]);
              auVar48._12_4_ = -(uint)(fStack_195c < tray.tfar.field_0.v[3]);
              uVar28 = movmskps((int)(root.ptr & 0xfffffffffffffff0),auVar48);
              bVar40 = true;
              if ((uint)POPCOUNT(uVar28) <= uVar36) {
                pNVar39->ptr = uVar26;
                pNVar39 = pNVar39 + 1;
                paVar38->v[0] = local_1968;
                paVar38->v[1] = fStack_1964;
                paVar38->v[2] = fStack_1960;
                paVar38->v[3] = fStack_195c;
                paVar38 = paVar38 + 1;
                goto LAB_00246418;
              }
            }
            uVar28 = (undefined4)sVar146;
            root.ptr = uVar26;
          } while (bVar40);
        }
      }
      goto LAB_00246c14;
    }
  }
  return;
  while( true ) {
    uVar30 = uVar30 + 1;
    lVar33 = lVar33 + 0xe0;
    if (uVar26 <= uVar30) break;
LAB_002464fb:
    uVar67 = auVar63._4_4_;
    uVar70 = auVar63._8_4_;
    uVar73 = auVar63._12_4_;
    pBVar31 = (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
               *)0x0;
    uVar103 = auVar63._0_4_;
    uVar104 = uVar67;
    uVar105 = uVar70;
    uVar106 = uVar73;
    while (uVar35 = (ulong)*(uint *)(lVar33 + (long)pBVar31 * 4), pBVar32 = pBVar31,
          uVar35 != 0xffffffff) {
      fVar59 = *(float *)(lVar33 + -0xc0 + (long)pBVar31 * 4);
      fVar65 = *(float *)(lVar33 + -0xb0 + (long)pBVar31 * 4);
      fVar68 = *(float *)(lVar33 + -0xa0 + (long)pBVar31 * 4);
      fVar71 = *(float *)(lVar33 + -0x90 + (long)pBVar31 * 4);
      fVar102 = *(float *)(lVar33 + -0x80 + (long)pBVar31 * 4);
      fVar41 = *(float *)(lVar33 + -0x70 + (long)pBVar31 * 4);
      fVar56 = *(float *)(lVar33 + -0x30 + (long)pBVar31 * 4);
      fVar58 = *(float *)(lVar33 + -0x20 + (long)pBVar31 * 4);
      fVar57 = *(float *)(lVar33 + -0x10 + (long)pBVar31 * 4);
      fVar80 = fVar58 - fVar65;
      fVar140 = fVar65 - fVar102;
      fVar96 = fVar57 - fVar68;
      fVar118 = fVar68 - fVar41;
      fVar131 = fVar118 * fVar80 - fVar140 * fVar96;
      fVar116 = fVar56 - fVar59;
      fVar108 = fVar59 - fVar71;
      fVar97 = fVar96 * fVar108 - fVar118 * fVar116;
      fVar117 = fVar116 * fVar140 - fVar80 * fVar108;
      local_1848 = SUB84(p_Var11,0);
      fStack_1844 = (float)((ulong)p_Var11 >> 0x20);
      fStack_1840 = SUB84(pcVar12,0);
      fStack_183c = (float)((ulong)pcVar12 >> 0x20);
      fVar76 = fVar65 - local_1848;
      fVar77 = fVar65 - fStack_1844;
      fVar78 = fVar65 - fStack_1840;
      fVar65 = fVar65 - fStack_183c;
      local_1858 = SUB84(p_Var13,0);
      fStack_1854 = (float)((ulong)p_Var13 >> 0x20);
      fStack_1850 = SUB84(p_Var14,0);
      fStack_184c = (float)((ulong)p_Var14 >> 0x20);
      fVar60 = fVar68 - local_1858;
      fVar66 = fVar68 - fStack_1854;
      fVar69 = fVar68 - fStack_1850;
      fVar68 = fVar68 - fStack_184c;
      local_1868 = SUB84(pcVar17,0);
      fStack_1864 = (float)((ulong)pcVar17 >> 0x20);
      fStack_1860 = SUB84(p_Var18,0);
      fStack_185c = (float)((ulong)p_Var18 >> 0x20);
      fVar86 = auVar23._0_4_;
      fVar87 = auVar23._4_4_;
      fVar95 = auVar23._8_4_;
      fVar100 = fVar76 * fVar86 - fVar60 * local_1868;
      fVar101 = fVar77 * fVar87 - fVar66 * fStack_1864;
      fVar92 = fVar78 * fVar95 - fVar69 * fStack_1860;
      fVar94 = fVar65 * fStack_186c - fVar68 * fStack_185c;
      local_1838 = SUB84(This->ptr,0);
      fStack_1834 = (float)((ulong)This->ptr >> 0x20);
      fStack_1830 = SUB84(This->leafIntersector,0);
      fStack_182c = (float)((ulong)This->leafIntersector >> 0x20);
      fVar72 = fVar59 - local_1838;
      fVar74 = fVar59 - fStack_1834;
      fVar75 = fVar59 - fStack_1830;
      fVar59 = fVar59 - fStack_182c;
      local_1888 = SUB84(p_Var21,0);
      fStack_1884 = (float)((ulong)p_Var21 >> 0x20);
      fStack_1880 = SUB84(p_Var19,0);
      fStack_187c = (float)((ulong)p_Var19 >> 0x20);
      fVar109 = fVar60 * local_1888 - fVar72 * fVar86;
      fVar113 = fVar66 * fStack_1884 - fVar74 * fVar87;
      fVar114 = fVar69 * fStack_1880 - fVar75 * fVar95;
      fVar115 = fVar68 * fStack_187c - fVar59 * fStack_186c;
      fVar81 = fVar72 * local_1868 - fVar76 * local_1888;
      fVar82 = fVar74 * fStack_1864 - fVar77 * fStack_1884;
      fVar83 = fVar75 * fStack_1860 - fVar78 * fStack_1880;
      fVar85 = fVar59 * fStack_185c - fVar65 * fStack_187c;
      fVar86 = fVar131 * local_1888 + local_1868 * fVar97 + fVar117 * fVar86;
      fVar87 = fVar131 * fStack_1884 + fStack_1864 * fVar97 + fVar117 * fVar87;
      fVar95 = fVar131 * fStack_1880 + fStack_1860 * fVar97 + fVar117 * fVar95;
      fVar107 = fVar131 * fStack_187c + fStack_185c * fVar97 + fVar117 * fStack_186c;
      uVar119 = (uint)fVar86 & 0x80000000;
      uVar120 = (uint)fVar87 & 0x80000000;
      uVar121 = (uint)fVar95 & 0x80000000;
      uVar122 = (uint)fVar107 & 0x80000000;
      fVar124 = (float)((uint)(fVar116 * fVar100 + fVar80 * fVar109 + fVar96 * fVar81) ^ uVar119);
      fVar126 = (float)((uint)(fVar116 * fVar101 + fVar80 * fVar113 + fVar96 * fVar82) ^ uVar120);
      fVar128 = (float)((uint)(fVar116 * fVar92 + fVar80 * fVar114 + fVar96 * fVar83) ^ uVar121);
      fVar80 = (float)((uint)(fVar116 * fVar94 + fVar80 * fVar115 + fVar96 * fVar85) ^ uVar122);
      uVar142 = -(uint)(0.0 <= fVar124) & uVar103;
      uVar143 = -(uint)(0.0 <= fVar126) & uVar104;
      uVar144 = -(uint)(0.0 <= fVar128) & uVar105;
      uVar145 = -(uint)(0.0 <= fVar80) & uVar106;
      auVar10._4_4_ = uVar143;
      auVar10._0_4_ = uVar142;
      auVar10._8_4_ = uVar144;
      auVar10._12_4_ = uVar145;
      iVar27 = movmskps((int)this,auVar10);
      local_1898 = SUB84(p_Var15,0);
      fStack_1894 = (float)((ulong)p_Var15 >> 0x20);
      fStack_1890 = SUB84(pcVar16,0);
      fStack_188c = (float)((ulong)pcVar16 >> 0x20);
      local_18a8 = SUB84(pcVar20,0);
      fStack_18a4 = (float)((ulong)pcVar20 >> 0x20);
      fStack_18a0 = SUB84(p_Var22,0);
      fStack_189c = (float)((ulong)p_Var22 >> 0x20);
      if (iVar27 != 0) {
        fVar81 = (float)((uint)(fVar108 * fVar100 + fVar140 * fVar109 + fVar118 * fVar81) ^ uVar119)
        ;
        fVar82 = (float)((uint)(fVar108 * fVar101 + fVar140 * fVar113 + fVar118 * fVar82) ^ uVar120)
        ;
        fVar83 = (float)((uint)(fVar108 * fVar92 + fVar140 * fVar114 + fVar118 * fVar83) ^ uVar121);
        fVar85 = (float)((uint)(fVar108 * fVar94 + fVar140 * fVar115 + fVar118 * fVar85) ^ uVar122);
        auVar79._0_4_ = -(uint)(0.0 <= fVar81) & uVar142;
        auVar79._4_4_ = -(uint)(0.0 <= fVar82) & uVar143;
        auVar79._8_4_ = -(uint)(0.0 <= fVar83) & uVar144;
        auVar79._12_4_ = -(uint)(0.0 <= fVar85) & uVar145;
        iVar27 = movmskps(iVar27,auVar79);
        if (iVar27 != 0) {
          fVar100 = ABS(fVar86);
          fVar101 = ABS(fVar87);
          fVar92 = ABS(fVar95);
          fVar94 = ABS(fVar107);
          auVar50._0_4_ = -(uint)(fVar81 <= fVar100 - fVar124) & auVar79._0_4_;
          auVar50._4_4_ = -(uint)(fVar82 <= fVar101 - fVar126) & auVar79._4_4_;
          auVar50._8_4_ = -(uint)(fVar83 <= fVar92 - fVar128) & auVar79._8_4_;
          auVar50._12_4_ = -(uint)(fVar85 <= fVar94 - fVar80) & auVar79._12_4_;
          iVar27 = movmskps(iVar27,auVar50);
          if (iVar27 != 0) {
            fVar60 = (float)(uVar119 ^ (uint)(fVar72 * fVar131 + fVar76 * fVar97 + fVar117 * fVar60)
                            );
            fVar66 = (float)(uVar120 ^ (uint)(fVar74 * fVar131 + fVar77 * fVar97 + fVar117 * fVar66)
                            );
            fVar69 = (float)(uVar121 ^ (uint)(fVar75 * fVar131 + fVar78 * fVar97 + fVar117 * fVar69)
                            );
            fVar59 = (float)(uVar122 ^ (uint)(fVar59 * fVar131 + fVar65 * fVar97 + fVar117 * fVar68)
                            );
            uVar119 = -(uint)(fVar60 <= fVar100 * local_18a8 && fVar100 * local_1898 < fVar60) &
                      auVar50._0_4_;
            uVar120 = -(uint)(fVar66 <= fVar101 * fStack_18a4 && fVar101 * fStack_1894 < fVar66) &
                      auVar50._4_4_;
            uVar121 = -(uint)(fVar69 <= fVar92 * fStack_18a0 && fVar92 * fStack_1890 < fVar69) &
                      auVar50._8_4_;
            uVar122 = -(uint)(fVar59 <= fVar94 * fStack_189c && fVar94 * fStack_188c < fVar59) &
                      auVar50._12_4_;
            auVar5._4_4_ = uVar120;
            auVar5._0_4_ = uVar119;
            auVar5._8_4_ = uVar121;
            auVar5._12_4_ = uVar122;
            iVar27 = movmskps(iVar27,auVar5);
            if (iVar27 != 0) {
              uVar119 = -(uint)(fVar86 != 0.0) & uVar119;
              uVar120 = -(uint)(fVar87 != 0.0) & uVar120;
              uVar121 = -(uint)(fVar95 != 0.0) & uVar121;
              uVar122 = -(uint)(fVar107 != 0.0) & uVar122;
              auVar3._4_4_ = uVar120;
              auVar3._0_4_ = uVar119;
              auVar3._8_4_ = uVar121;
              auVar3._12_4_ = uVar122;
              iVar27 = movmskps(iVar27,auVar3);
              if (iVar27 != 0) {
                lVar2 = *(long *)(*(long *)(*(long *)ray + 0x1e8) + uVar35 * 8);
                uVar142 = *(uint *)(lVar2 + 0x34);
                auVar51._0_4_ = -(uint)((uVar142 & uVar25) == 0);
                auVar51._4_4_ = -(uint)((uVar142 & uVar90) == 0);
                auVar51._8_4_ = -(uint)((uVar142 & uVar91) == 0);
                auVar51._12_4_ = -(uint)((uVar142 & uVar93) == 0);
                auVar52._4_4_ = uVar120;
                auVar52._0_4_ = uVar119;
                auVar52._8_4_ = uVar121;
                auVar52._12_4_ = uVar122;
                auVar52 = ~auVar51 & auVar52;
                iVar27 = movmskps((int)lVar2,auVar52);
                if (iVar27 != 0) {
                  uVar103 = ~auVar52._0_4_ & uVar103;
                  uVar104 = ~auVar52._4_4_ & uVar104;
                  uVar105 = ~auVar52._8_4_ & uVar105;
                  uVar106 = ~auVar52._12_4_ & uVar106;
                }
              }
            }
          }
        }
      }
      auVar7._4_4_ = uVar104;
      auVar7._0_4_ = uVar103;
      auVar7._8_4_ = uVar105;
      auVar7._12_4_ = uVar106;
      iVar27 = movmskps(iVar27,auVar7);
      if (iVar27 == 0) {
        uVar119 = 0;
      }
      else {
        fVar59 = *(float *)(lVar33 + -0x60 + (long)pBVar31 * 4);
        fVar65 = *(float *)(lVar33 + -0x50 + (long)pBVar31 * 4);
        fVar68 = *(float *)(lVar33 + -0x40 + (long)pBVar31 * 4);
        fVar115 = fVar59 - fVar56;
        fVar116 = fVar59 - fVar56;
        fVar117 = fVar59 - fVar56;
        fVar56 = fVar59 - fVar56;
        fVar118 = fVar65 - fVar58;
        fVar126 = fVar65 - fVar58;
        fVar131 = fVar65 - fVar58;
        fVar58 = fVar65 - fVar58;
        fVar86 = fVar68 - fVar57;
        fVar95 = fVar68 - fVar57;
        fVar101 = fVar68 - fVar57;
        fVar57 = fVar68 - fVar57;
        fVar96 = fVar71 - fVar59;
        fVar97 = fVar71 - fVar59;
        fVar107 = fVar71 - fVar59;
        fVar71 = fVar71 - fVar59;
        fVar74 = fVar102 - fVar65;
        fVar75 = fVar102 - fVar65;
        fVar76 = fVar102 - fVar65;
        fVar102 = fVar102 - fVar65;
        fVar82 = fVar41 - fVar68;
        fVar83 = fVar41 - fVar68;
        fVar85 = fVar41 - fVar68;
        fVar41 = fVar41 - fVar68;
        fVar108 = fVar74 * fVar86 - fVar82 * fVar118;
        fVar109 = fVar75 * fVar95 - fVar83 * fVar126;
        fVar113 = fVar76 * fVar101 - fVar85 * fVar131;
        fVar114 = fVar102 * fVar57 - fVar41 * fVar58;
        fVar87 = fVar82 * fVar115 - fVar96 * fVar86;
        fVar100 = fVar83 * fVar116 - fVar97 * fVar95;
        fVar92 = fVar85 * fVar117 - fVar107 * fVar101;
        fVar94 = fVar41 * fVar56 - fVar71 * fVar57;
        fVar60 = fVar96 * fVar118 - fVar74 * fVar115;
        fVar66 = fVar97 * fVar126 - fVar75 * fVar116;
        fVar69 = fVar107 * fVar131 - fVar76 * fVar117;
        fVar72 = fVar71 * fVar58 - fVar102 * fVar56;
        local_1838 = fVar59 - local_1838;
        fStack_1834 = fVar59 - fStack_1834;
        fStack_1830 = fVar59 - fStack_1830;
        fVar59 = fVar59 - fStack_182c;
        local_1848 = fVar65 - local_1848;
        fStack_1844 = fVar65 - fStack_1844;
        fStack_1840 = fVar65 - fStack_1840;
        fVar65 = fVar65 - fStack_183c;
        local_1858 = fVar68 - local_1858;
        fStack_1854 = fVar68 - fStack_1854;
        fStack_1850 = fVar68 - fStack_1850;
        fVar68 = fVar68 - fStack_184c;
        fVar124 = local_1848 * local_1878 - local_1858 * local_1868;
        fVar128 = fStack_1844 * fStack_1874 - fStack_1854 * fStack_1864;
        fVar140 = fStack_1840 * fStack_1870 - fStack_1850 * fStack_1860;
        fVar130 = fVar65 * fStack_186c - fVar68 * fStack_185c;
        fVar132 = local_1858 * local_1888 - local_1838 * local_1878;
        fVar133 = fStack_1854 * fStack_1884 - fStack_1834 * fStack_1874;
        fVar134 = fStack_1850 * fStack_1880 - fStack_1830 * fStack_1870;
        fVar135 = fVar68 * fStack_187c - fVar59 * fStack_186c;
        fVar136 = local_1838 * local_1868 - local_1848 * local_1888;
        fVar137 = fStack_1834 * fStack_1864 - fStack_1844 * fStack_1884;
        fVar138 = fStack_1830 * fStack_1860 - fStack_1840 * fStack_1880;
        fVar139 = fVar59 * fStack_185c - fVar65 * fStack_187c;
        fVar77 = fVar108 * local_1888 + local_1868 * fVar87 + fVar60 * local_1878;
        fVar78 = fVar109 * fStack_1884 + fStack_1864 * fVar100 + fVar66 * fStack_1874;
        fVar80 = fVar113 * fStack_1880 + fStack_1860 * fVar92 + fVar69 * fStack_1870;
        fVar81 = fVar114 * fStack_187c + fStack_185c * fVar94 + fVar72 * fStack_186c;
        uVar120 = (uint)fVar77 & 0x80000000;
        uVar121 = (uint)fVar78 & 0x80000000;
        uVar122 = (uint)fVar80 & 0x80000000;
        uVar142 = (uint)fVar81 & 0x80000000;
        fVar74 = (float)((uint)(fVar96 * fVar124 + fVar74 * fVar132 + fVar82 * fVar136) ^ uVar120);
        fVar75 = (float)((uint)(fVar97 * fVar128 + fVar75 * fVar133 + fVar83 * fVar137) ^ uVar121);
        fVar76 = (float)((uint)(fVar107 * fVar140 + fVar76 * fVar134 + fVar85 * fVar138) ^ uVar122);
        fVar71 = (float)((uint)(fVar71 * fVar130 + fVar102 * fVar135 + fVar41 * fVar139) ^ uVar142);
        uVar143 = -(uint)(0.0 <= fVar74) & uVar103;
        uVar144 = -(uint)(0.0 <= fVar75) & uVar104;
        uVar145 = -(uint)(0.0 <= fVar76) & uVar105;
        uVar141 = -(uint)(0.0 <= fVar71) & uVar106;
        auVar9._4_4_ = uVar144;
        auVar9._0_4_ = uVar143;
        auVar9._8_4_ = uVar145;
        auVar9._12_4_ = uVar141;
        uVar119 = movmskps(iVar27,auVar9);
        if (uVar119 == 0) {
LAB_002468b4:
          uVar34 = (ulong)uVar119;
        }
        else {
          fVar102 = (float)((uint)(fVar115 * fVar124 + fVar118 * fVar132 + fVar86 * fVar136) ^
                           uVar120);
          fVar41 = (float)((uint)(fVar116 * fVar128 + fVar126 * fVar133 + fVar95 * fVar137) ^
                          uVar121);
          fVar82 = (float)((uint)(fVar117 * fVar140 + fVar131 * fVar134 + fVar101 * fVar138) ^
                          uVar122);
          fVar56 = (float)((uint)(fVar56 * fVar130 + fVar58 * fVar135 + fVar57 * fVar139) ^ uVar142)
          ;
          uVar143 = -(uint)(0.0 <= fVar102) & uVar143;
          uVar144 = -(uint)(0.0 <= fVar41) & uVar144;
          uVar145 = -(uint)(0.0 <= fVar82) & uVar145;
          uVar141 = -(uint)(0.0 <= fVar56) & uVar141;
          auVar6._4_4_ = uVar144;
          auVar6._0_4_ = uVar143;
          auVar6._8_4_ = uVar145;
          auVar6._12_4_ = uVar141;
          uVar119 = movmskps(uVar119,auVar6);
          if (uVar119 == 0) goto LAB_002468b4;
          fVar58 = ABS(fVar77);
          fVar57 = ABS(fVar78);
          fVar83 = ABS(fVar80);
          fVar85 = ABS(fVar81);
          auVar112._0_4_ = -(uint)(fVar102 <= fVar58 - fVar74) & uVar143;
          auVar112._4_4_ = -(uint)(fVar41 <= fVar57 - fVar75) & uVar144;
          auVar112._8_4_ = -(uint)(fVar82 <= fVar83 - fVar76) & uVar145;
          auVar112._12_4_ = -(uint)(fVar56 <= fVar85 - fVar71) & uVar141;
          uVar119 = movmskps(uVar119,auVar112);
          uVar34 = (ulong)uVar119;
          if (uVar119 != 0) {
            fVar71 = (float)(uVar120 ^
                            (uint)(local_1838 * fVar108 + local_1848 * fVar87 + fVar60 * local_1858)
                            );
            fVar102 = (float)(uVar121 ^
                             (uint)(fStack_1834 * fVar109 +
                                   fStack_1844 * fVar100 + fVar66 * fStack_1854));
            fVar41 = (float)(uVar122 ^
                            (uint)(fStack_1830 * fVar113 +
                                  fStack_1840 * fVar92 + fVar69 * fStack_1850));
            fVar59 = (float)(uVar142 ^ (uint)(fVar59 * fVar114 + fVar65 * fVar94 + fVar72 * fVar68))
            ;
            uVar120 = -(uint)(fVar71 <= fVar58 * local_18a8 && fVar58 * local_1898 < fVar71) &
                      auVar112._0_4_;
            uVar121 = -(uint)(fVar102 <= fVar57 * fStack_18a4 && fVar57 * fStack_1894 < fVar102) &
                      auVar112._4_4_;
            uVar122 = -(uint)(fVar41 <= fVar83 * fStack_18a0 && fVar83 * fStack_1890 < fVar41) &
                      auVar112._8_4_;
            uVar142 = -(uint)(fVar59 <= fVar85 * fStack_189c && fVar85 * fStack_188c < fVar59) &
                      auVar112._12_4_;
            auVar4._4_4_ = uVar121;
            auVar4._0_4_ = uVar120;
            auVar4._8_4_ = uVar122;
            auVar4._12_4_ = uVar142;
            uVar119 = movmskps(uVar119,auVar4);
            uVar34 = (ulong)uVar119;
            if (uVar119 != 0) {
              auVar54._0_4_ = -(uint)(fVar77 != 0.0) & uVar120;
              auVar54._4_4_ = -(uint)(fVar78 != 0.0) & uVar121;
              auVar54._8_4_ = -(uint)(fVar80 != 0.0) & uVar122;
              auVar54._12_4_ = -(uint)(fVar81 != 0.0) & uVar142;
              uVar119 = movmskps(uVar119,auVar54);
              uVar34 = (ulong)uVar119;
              if (uVar119 != 0) {
                uVar34 = *(ulong *)(*(long *)ray + 0x1e8);
                lVar2 = *(long *)(uVar34 + uVar35 * 8);
                uVar119 = *(uint *)(lVar2 + 0x34);
                auVar53._0_4_ = -(uint)((uVar119 & uVar25) == 0);
                auVar53._4_4_ = -(uint)((uVar119 & uVar90) == 0);
                auVar53._8_4_ = -(uint)((uVar119 & uVar91) == 0);
                auVar53._12_4_ = -(uint)((uVar119 & uVar93) == 0);
                auVar54 = ~auVar53 & auVar54;
                iVar27 = movmskps((int)lVar2,auVar54);
                if (iVar27 != 0) {
                  uVar103 = ~auVar54._0_4_ & uVar103;
                  uVar104 = ~auVar54._4_4_ & uVar104;
                  uVar105 = ~auVar54._8_4_ & uVar105;
                  uVar106 = ~auVar54._12_4_ & uVar106;
                }
              }
            }
          }
        }
        auVar8._4_4_ = uVar104;
        auVar8._0_4_ = uVar103;
        auVar8._8_4_ = uVar105;
        auVar8._12_4_ = uVar106;
        iVar27 = movmskps((int)uVar34,auVar8);
        uVar119 = CONCAT31((int3)((uint)iVar27 >> 8),iVar27 != 0);
      }
      fVar71 = INFINITY;
      fVar68 = INFINITY;
      fVar65 = INFINITY;
      fVar59 = INFINITY;
      this = (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
              *)(ulong)uVar119;
      if (((char)uVar119 == '\0') ||
         (pBVar32 = pBVar31 + 1,
         bVar40 = (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
                   *)0x2 < pBVar31, pBVar31 = pBVar32, this = pBVar32, bVar40)) break;
    }
    auVar63._0_4_ = auVar63._0_4_ & uVar103;
    auVar63._4_4_ = uVar67 & uVar104;
    auVar63._8_4_ = uVar70 & uVar105;
    auVar63._12_4_ = uVar73 & uVar106;
    iVar27 = movmskps((int)pBVar32,auVar63);
    if (iVar27 == 0) break;
  }
  uVar30 = CONCAT44(auVar63._4_4_,auVar63._0_4_);
  aVar64._0_8_ = uVar30 ^ 0xffffffffffffffff;
  aVar64._8_4_ = auVar63._8_4_ ^ 0xffffffff;
  aVar64._12_4_ = auVar63._12_4_ ^ 0xffffffff;
LAB_00246be4:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       ((undefined1  [16])terminated.field_0 | (undefined1  [16])aVar64);
  iVar27 = movmskps((int)uVar26,(undefined1  [16])terminated.field_0);
  if (iVar27 == 0xf) {
LAB_00246c11:
    sVar146 = 3;
  }
  else {
    tray.tfar.field_0 =
         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
         blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01feba00,
                  (undefined1  [16])terminated.field_0);
    sVar146 = 0;
  }
LAB_00246c14:
  paVar37 = paVar38;
  if ((int)sVar146 == 3) {
    auVar55._4_4_ = uVar125 & terminated.field_0.i[1];
    auVar55._0_4_ = uVar123 & terminated.field_0.i[0];
    auVar55._8_4_ = uVar127 & terminated.field_0.i[2];
    auVar55._12_4_ = uVar129 & terminated.field_0.i[3];
    auVar62 = blendvps(*(undefined1 (*) [16])&(This->intersector4_nofilter).name,_DAT_01feba00,
                       auVar55);
    *(undefined1 (*) [16])&(This->intersector4_nofilter).name = auVar62;
    return;
  }
  goto LAB_00246222;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }